

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageHandler.cpp
# Opt level: O0

PDFFormXObject * __thiscall
JPEGImageHandler::CreateFormXObjectFromJPGStream
          (JPEGImageHandler *this,IByteReaderWithPosition *inJPGStream,ObjectIDType inFormXObjectID)

{
  int iVar1;
  EStatusCode EVar2;
  Trace *pTVar3;
  undefined4 extraout_var;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inImageXObjectID;
  EStatusCode status;
  LongFilePositionType recordedPosition;
  undefined1 local_290 [8];
  JPEGImageInformation imageInformation;
  JPEGImageParser jpgImageParser;
  PDFImageXObject *imageXObject;
  PDFFormXObject *imageFormXObject;
  ObjectIDType inFormXObjectID_local;
  IByteReaderWithPosition *inJPGStream_local;
  JPEGImageHandler *this_local;
  
  imageXObject = (PDFImageXObject *)0x0;
  jpgImageParser.mReadBuffer[0x1f0] = '\0';
  jpgImageParser.mReadBuffer[0x1f1] = '\0';
  jpgImageParser.mReadBuffer[0x1f2] = '\0';
  jpgImageParser.mReadBuffer[499] = '\0';
  jpgImageParser._508_4_ = 0;
  if (this->mObjectsContext == (ObjectsContext *)0x0) {
    pTVar3 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar3,
                      "JPEGImageHandler::CreateImageXObjectFromJPGStream. Unexpected Error, mDocumentContex not initialized with a document context"
                     );
  }
  else {
    JPEGImageParser::JPEGImageParser((JPEGImageParser *)&imageInformation.PhotoshopYDensity);
    JPEGImageInformation::JPEGImageInformation((JPEGImageInformation *)local_290);
    iVar1 = (*(inJPGStream->super_IByteReader)._vptr_IByteReader[6])();
    EVar2 = JPEGImageParser::Parse
                      ((JPEGImageParser *)&imageInformation.PhotoshopYDensity,inJPGStream,
                       (JPEGImageInformation *)local_290);
    if (EVar2 == eSuccess) {
      (*(inJPGStream->super_IByteReader)._vptr_IByteReader[4])
                (inJPGStream,CONCAT44(extraout_var,iVar1));
      this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
      inImageXObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
      jpgImageParser._504_8_ =
           CreateAndWriteImageXObjectFromJPGInformation
                     (this,inJPGStream,inImageXObjectID,(JPEGImageInformation *)local_290);
      if ((PDFImageXObject *)jpgImageParser._504_8_ == (PDFImageXObject *)0x0) {
        pTVar3 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar3,
                          "JPEGImageHandler::CreateFormXObjectFromJPGStream, unable to create image xobject"
                         );
      }
      else {
        imageXObject = (PDFImageXObject *)
                       CreateImageFormXObjectFromImageXObject
                                 (this,(PDFImageXObject *)jpgImageParser._504_8_,inFormXObjectID,
                                  (JPEGImageInformation *)local_290);
        if ((PDFFormXObject *)imageXObject == (PDFFormXObject *)0x0) {
          pTVar3 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar3,
                            "JPEGImageHandler::CreateImageXObjectFromJPGStream, unable to create form xobject"
                           );
        }
      }
    }
    else {
      pTVar3 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar3,
                        "JPEGImageHandler::CreateImageXObjectFromJPGStream. Failed to parse JPG stream"
                       );
    }
    JPEGImageParser::~JPEGImageParser((JPEGImageParser *)&imageInformation.PhotoshopYDensity);
  }
  if (jpgImageParser._504_8_ != 0) {
    PDFImageXObject::~PDFImageXObject((PDFImageXObject *)jpgImageParser._504_8_);
    operator_delete((void *)jpgImageParser._504_8_,0x20);
  }
  return (PDFFormXObject *)imageXObject;
}

Assistant:

PDFFormXObject* JPEGImageHandler::CreateFormXObjectFromJPGStream(IByteReaderWithPosition* inJPGStream,ObjectIDType inFormXObjectID)
{
	PDFFormXObject* imageFormXObject = NULL;
	PDFImageXObject* imageXObject = NULL;

	do
	{
		if(!mObjectsContext)
		{
			TRACE_LOG("JPEGImageHandler::CreateImageXObjectFromJPGStream. Unexpected Error, mDocumentContex not initialized with a document context");
			break;
		}

		JPEGImageParser jpgImageParser;
		JPEGImageInformation imageInformation;

		LongFilePositionType recordedPosition = inJPGStream->GetCurrentPosition();

		EStatusCode status = jpgImageParser.Parse(inJPGStream,imageInformation);
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("JPEGImageHandler::CreateImageXObjectFromJPGStream. Failed to parse JPG stream");
			break;
		}

		// reset image position after parsing header, for later content copying
		inJPGStream->SetPosition(recordedPosition);

		imageXObject = CreateAndWriteImageXObjectFromJPGInformation(inJPGStream,mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID(),imageInformation);
		if(!imageXObject)
		{
			TRACE_LOG("JPEGImageHandler::CreateFormXObjectFromJPGStream, unable to create image xobject");
			break;
		}

		// Write Image form XObject
		imageFormXObject = CreateImageFormXObjectFromImageXObject(imageXObject,inFormXObjectID,imageInformation);
		if(!imageFormXObject)
		{
			TRACE_LOG("JPEGImageHandler::CreateImageXObjectFromJPGStream, unable to create form xobject");
			break;
		}

	} while(false);

	delete imageXObject;
	return imageFormXObject;
}